

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaStringBuilder::AddNumber(VmaStringBuilder *this,uint64_t num)

{
  undefined1 auVar1 [16];
  ulong in_RSI;
  char *p;
  char buf [21];
  char *local_30;
  char *in_stack_ffffffffffffffd8;
  VmaStringBuilder *in_stack_ffffffffffffffe0;
  char local_15 [5];
  ulong local_10;
  
  local_15[1] = 0;
  local_30 = local_15 + 1;
  local_10 = in_RSI;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_10;
    local_30[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_10 = local_10 / 10;
    local_30 = local_30 + -1;
  } while (local_10 != 0);
  Add(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void VmaStringBuilder::AddNumber(uint64_t num)
{
    char buf[21];
    buf[20] = '\0';
    char* p = &buf[20];
    do
    {
        *--p = '0' + (num % 10);
        num /= 10;
    } while (num);
    Add(p);
}